

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

errr finish_parse_artifact(parser *p)

{
  artifact *paVar1;
  int iVar2;
  wchar_t tval;
  wchar_t wVar3;
  object_kind *poVar4;
  artifact *local_40;
  object_kind *kind;
  artifact *art;
  wchar_t aidx;
  wchar_t none;
  artifact *n;
  artifact *a;
  parser *p_local;
  
  z_info->a_max = 0;
  for (n = (artifact *)parser_priv(p); n != (artifact *)0x0; n = n->next) {
    z_info->a_max = z_info->a_max + 1;
  }
  a_info = (artifact *)mem_zalloc((long)(int)(z_info->a_max + 1) * 0x140);
  aup_info = (artifact_upkeep *)mem_zalloc((long)(int)(z_info->a_max + 1) << 3);
  art._0_4_ = (uint)z_info->a_max;
  n = (artifact *)parser_priv(p);
  while( true ) {
    if (n == (artifact *)0x0) {
      z_info->a_max = z_info->a_max + 1;
      tval = tval_find_idx("none");
      wVar3 = lookup_sval(tval,"<unknown item>");
      unknown_item_kind = lookup_kind(tval,wVar3);
      wVar3 = lookup_sval(tval,"<unknown treasure>");
      unknown_gold_kind = lookup_kind(tval,wVar3);
      wVar3 = lookup_sval(tval,"<pile>");
      pile_kind = lookup_kind(tval,wVar3);
      wVar3 = lookup_sval(tval,"<curse object>");
      curse_object_kind = lookup_kind(tval,wVar3);
      write_curse_kinds();
      for (art._0_4_ = 1; paVar1 = a_info, (int)(uint)art < (int)(uint)z_info->a_max;
          art._0_4_ = (uint)art + 1) {
        poVar4 = lookup_kind(a_info[(int)(uint)art].tval,a_info[(int)(uint)art].sval);
        if ((uint)z_info->ordinary_kind_max < poVar4->kidx) {
          poVar4->level = paVar1[(int)(uint)art].level;
          poVar4->effect = paVar1[(int)(uint)art].effect;
          poVar4->effect_msg = paVar1[(int)(uint)art].effect_msg;
          if (poVar4->tval != 0x13) {
            iVar2 = paVar1[(int)(uint)art].time.dice;
            (poVar4->time).base = paVar1[(int)(uint)art].time.base;
            (poVar4->time).dice = iVar2;
            iVar2 = paVar1[(int)(uint)art].time.m_bonus;
            (poVar4->time).sides = paVar1[(int)(uint)art].time.sides;
            (poVar4->time).m_bonus = iVar2;
          }
        }
      }
      parser_destroy(p);
      return 0;
    }
    if ((int)(uint)art < 1) break;
    memcpy(a_info + (int)(uint)art,n,0x140);
    a_info[(int)(uint)art].aidx = (uint)art;
    paVar1 = n->next;
    if ((int)(uint)art < (int)(uint)z_info->a_max) {
      local_40 = a_info + (int)((uint)art + 1);
    }
    else {
      local_40 = (artifact *)0x0;
    }
    a_info[(int)(uint)art].next = local_40;
    mem_free(n);
    aup_info[(int)(uint)art].aidx = (uint)art;
    art._0_4_ = (uint)art - 1;
    n = paVar1;
  }
  __assert_fail("aidx > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                ,0xcc0,"errr finish_parse_artifact(struct parser *)");
}

Assistant:

static errr finish_parse_artifact(struct parser *p) {
	struct artifact *a, *n;
	int none, aidx;

	/* Scan the list for the max id */
	z_info->a_max = 0;
	a = parser_priv(p);
	while (a) {
		z_info->a_max++;
		a = a->next;
	}

	/* Allocate the direct access list and copy the data to it */
	a_info = mem_zalloc((z_info->a_max + 1) * sizeof(*a));
	aup_info = mem_zalloc((z_info->a_max + 1) * sizeof(*aup_info));
	aidx = z_info->a_max;
	for (a = parser_priv(p); a; a = n, aidx--) {
		assert(aidx > 0);

		memcpy(&a_info[aidx], a, sizeof(*a));
		a_info[aidx].aidx = aidx;
		n = a->next;
		a_info[aidx].next = (aidx < z_info->a_max) ?
			&a_info[aidx + 1] : NULL;
		mem_free(a);

		aup_info[aidx].aidx = aidx;
	}
	z_info->a_max += 1;

	/* Now we're done with object kinds, deal with object-like things... */
	none = tval_find_idx("none");
	unknown_item_kind = lookup_kind(none, lookup_sval(none, "<unknown item>"));
	unknown_gold_kind = lookup_kind(none,
									lookup_sval(none, "<unknown treasure>"));
	pile_kind = lookup_kind(none, lookup_sval(none, "<pile>"));
	curse_object_kind = lookup_kind(none, lookup_sval(none, "<curse object>"));
	write_curse_kinds();

	/* ..and fill in all object data */
	for (aidx = 1; aidx < z_info->a_max; aidx++) {
		struct artifact *art = &a_info[aidx];
		struct object_kind *kind = lookup_kind(art->tval, art->sval);
		if (kind->kidx > z_info->ordinary_kind_max) {
			kind->level = art->level;
			kind->effect = art->effect;
			kind->effect_msg = art->effect_msg;
			/*
			 * Timeout for a light already handled in
			 * parse_artifact_time().
			 */
			if (kind->tval != TV_LIGHT) {
				kind->time = art->time;
			}
		}
	}

	parser_destroy(p);
	return 0;
}